

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmPLoad<(moira::Instr)183,(moira::Mode)10,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  bool bVar1;
  StrWriter *pSVar2;
  char *local_68;
  Fc local_4c;
  int local_48;
  undefined1 local_40 [8];
  Ea<(moira::Mode)10,_4> ea;
  u32 ext;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  ea.ext3 = *addr;
  ea.ext2 = dasmIncRead<2>(this,addr);
  Op<(moira::Mode)10,4>((Ea<(moira::Mode)10,_4> *)local_40,this,op & 7,addr);
  if (((str->style->syntax != GNU) && (str->style->syntax != GNU_MIT)) ||
     (bVar1 = isValidExtMMU(this,PLOAD,IXPC,op,ea.ext2), bVar1)) {
    pSVar2 = StrWriter::operator<<(str);
    if ((ea.ext2 & 0x200U) == 0) {
      local_68 = "w";
    }
    else {
      local_68 = "r";
    }
    pSVar2 = StrWriter::operator<<(pSVar2,local_68);
    local_48 = (str->tab).raw;
    StrWriter::operator<<(pSVar2,(Tab)local_48);
    Fc::Fc(&local_4c,ea.ext2 & 0x1f);
    pSVar2 = StrWriter::operator<<(str,local_4c);
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Ea<(moira::Mode)10,_4> *)local_40);
  }
  else {
    *addr = ea.ext3;
    dasmIllegal<(moira::Instr)183,(moira::Mode)10,4>(this,str,addr,op);
  }
  return;
}

Assistant:

void
Moira::dasmPLoad(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto ea  = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << ((ext & 0x200) ? "r" : "w") << str.tab;
    str << Fc(ext & 0b11111) << Sep{} << ea;
}